

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cpp
# Opt level: O3

void testing::internal::LogWithLocation(LogSeverity severity,char *file,int line,string *message)

{
  size_t sVar1;
  ostream *poVar2;
  ostringstream s;
  string local_1b8;
  long local_198 [14];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  if (file == (char *)0x0) {
    std::ios::clear((int)&local_1b8 + (int)*(undefined8 *)(local_198[0] + -0x18) + 0x20);
  }
  else {
    sVar1 = strlen(file);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,file,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,":",1);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_198,line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(message->_M_dataplus)._M_p,message->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(severity,&local_1b8,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

GTEST_API_ void LogWithLocation(testing::internal::LogSeverity severity,
                                const char* file, int line,
                                const string& message) {
  ::std::ostringstream s;
  s << file << ":" << line << ": " << message << ::std::endl;
  Log(severity, s.str(), 0);
}